

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::
SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>
          (SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL> *this,
          Feature *arg_list_begin,Feature *arg_list_end)

{
  Feature *pFVar1;
  size_t i;
  size_t sVar2;
  size_t count;
  
  (this->super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).
  buffer_size = 0;
  (this->super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
       (Feature *)&this->stack_storage;
  this->buffer_capacity = 8;
  count = (long)arg_list_end - (long)arg_list_begin >> 2;
  reserve(this,count);
  pFVar1 = (this->super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>)
           .ptr;
  for (sVar2 = 0; count != sVar2; sVar2 = sVar2 + 1) {
    pFVar1[sVar2] = arg_list_begin[sVar2];
  }
  (this->super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).
  buffer_size = count;
  return;
}

Assistant:

SmallVector(const U *arg_list_begin, const U *arg_list_end) SPIRV_CROSS_NOEXCEPT : SmallVector()
	{
		auto count = size_t(arg_list_end - arg_list_begin);
		reserve(count);
		for (size_t i = 0; i < count; i++, arg_list_begin++)
			new (&this->ptr[i]) T(*arg_list_begin);
		this->buffer_size = count;
	}